

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

float __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::computeLevelFromLod
          (TextureQueryLodInstance *this,float computedLod)

{
  FilterMode FVar1;
  TextureSpec *pTVar2;
  float fVar3;
  float fVar4;
  
  pTVar2 = (this->super_TextureQueryInstance).m_textureSpec;
  FVar1 = (pTVar2->sampler).minFilter;
  fVar3 = 0.0;
  if (FVar1 - NEAREST_MIPMAP_NEAREST < 4) {
    fVar4 = (float)(pTVar2->numLevels + -1);
    fVar3 = (float)(-(uint)(0.0 < computedLod) &
                   (~-(uint)(fVar4 <= computedLod) & (uint)computedLod |
                   -(uint)(fVar4 <= computedLod) & (uint)fVar4));
    switch(FVar1) {
    default:
      fVar3 = ceilf(fVar3 + 0.5);
      fVar3 = fVar3 + -1.0;
      return (float)(-(uint)(0.0 < fVar3) &
                    (~-(uint)(fVar4 <= fVar3) & (uint)fVar3 | (uint)fVar4 & -(uint)(fVar4 <= fVar3))
                    );
    case NEAREST_MIPMAP_LINEAR:
    case LINEAR_MIPMAP_LINEAR:
    }
  }
  return fVar3;
}

Assistant:

float TextureQueryLodInstance::computeLevelFromLod (float computedLod) const
{
	const int	maxAccessibleLevel	= m_textureSpec.numLevels - 1;

	// Clamp the computed LOD to the range of accessible levels.
	computedLod = deFloatClamp(computedLod, 0.0f, (float)maxAccessibleLevel);

	// Return a value according to the min filter.
	switch (m_textureSpec.sampler.minFilter)
	{
		case tcu::Sampler::LINEAR:
		case tcu::Sampler::NEAREST:
			return 0.0f;

		case tcu::Sampler::NEAREST_MIPMAP_NEAREST:
		case tcu::Sampler::LINEAR_MIPMAP_NEAREST:
			return deFloatClamp(deFloatCeil(computedLod + 0.5f) - 1.0f, 0.0f, (float)maxAccessibleLevel);

		case tcu::Sampler::NEAREST_MIPMAP_LINEAR:
		case tcu::Sampler::LINEAR_MIPMAP_LINEAR:
			return computedLod;

		default:
			DE_ASSERT(false);
			return 0.0f;
	}
}